

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O1

int parse_integer(char *buffer,int num_digits,int use_leading_spaces,int *value)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  
  if (1 < num_digits && use_leading_spaces != 0) {
    pcVar2 = buffer + (ulong)(num_digits - 2) + 1;
    do {
      if (*buffer != ' ') goto LAB_00128899;
      buffer = buffer + 1;
      bVar1 = 2 < num_digits;
      num_digits = num_digits + -1;
    } while (bVar1);
    num_digits = 1;
    buffer = pcVar2;
  }
LAB_00128899:
  *value = 0;
  if (0 < num_digits) {
    iVar3 = num_digits + 1;
    do {
      if ((byte)(*buffer - 0x3aU) < 0xf6) {
        return -1;
      }
      *value = (uint)(byte)(*buffer - 0x30) + *value * 10;
      buffer = buffer + 1;
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  return 0;
}

Assistant:

static int parse_integer(const char *buffer, int num_digits, int use_leading_spaces, int *value)
{
    if (use_leading_spaces)
    {
        while (num_digits > 1 && *buffer == ' ')
        {
            buffer++;
            num_digits--;
        }
    }
    *value = 0;
    while (num_digits > 0)
    {
        if (*buffer < '0' || *buffer > '9')
        {
            return -1;
        }
        *value = (*value) * 10 + (*buffer - '0');
        buffer++;
        num_digits--;
    }

    return 0;
}